

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  AtomicDouble *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PixelSensor *this_00;
  Pixel *pPVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  double dVar10;
  long lVar11;
  GaussianFilter *this_01;
  MitchellFilter *this_02;
  uint uVar12;
  ulong uVar13;
  undefined8 unaff_R15;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  float fVar17;
  Float FVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [56];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [60];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  uint uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  RGB RVar38;
  SampledSpectrum H;
  Tuple2<pbrt::Point2,_float> local_a8;
  float local_a0;
  uint local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  SampledSpectrum local_58;
  undefined1 local_48 [4];
  float afStack_44 [5];
  
  auVar32._8_56_ = L._16_56_;
  auVar32._0_8_ = L.values.values._8_8_;
  auVar34._8_56_ = L._8_56_;
  auVar34._0_8_ = L.values.values._0_8_;
  _local_48 = vmovlhps_avx(auVar34._0_16_,auVar32._0_16_);
  auVar27 = ZEXT1260(local_48._4_12_);
  if (!NAN(L.values.values[0])) {
    uVar9 = 0xffffffffffffffff;
    do {
      if (uVar9 == 2) goto LAB_003a11d9;
      lVar11 = uVar9 * 4;
      uVar9 = uVar9 + 1;
    } while (!NAN(*(float *)(local_48 + lVar11 + 8)) && !NAN(*(float *)(local_48 + lVar11 + 8)));
    if (2 < uVar9) {
LAB_003a11d9:
      this_00 = (this->super_FilmBase).sensor;
      fVar17 = this_00->imagingRatio;
      local_58.values.values[0] = fVar17 * (float)local_48;
      local_58.values.values[1] = fVar17 * afStack_44[0];
      local_58.values.values[2] = fVar17 * afStack_44[1];
      local_58.values.values[3] = fVar17 * afStack_44[2];
      auVar22 = ZEXT856(local_58.values.values._8_8_);
      RVar38 = PixelSensor::ToSensorRGB(this_00,&local_58,lambda);
      auVar35._0_4_ = RVar38.b;
      auVar35._4_60_ = auVar27;
      auVar31._0_8_ = RVar38._0_8_;
      auVar31._8_56_ = auVar22;
      local_78 = auVar31._0_16_;
      auVar6 = vmovshdup_avx(local_78);
      auVar34 = ZEXT1664(auVar35._0_16_);
      auVar6 = vmaxss_avx(auVar6,local_78);
      auVar6 = vmaxss_avx(auVar35._0_16_,auVar6);
      if (this->maxComponentValue < auVar6._0_4_) {
        fVar17 = this->maxComponentValue / auVar6._0_4_;
        auVar34 = ZEXT464((uint)(auVar35._0_4_ * fVar17));
        local_78._0_4_ = RVar38.r * fVar17;
        local_78._4_4_ = RVar38.g * fVar17;
        local_78._8_4_ = auVar22._0_4_ * fVar17;
        local_78._12_4_ = auVar22._4_4_ * fVar17;
        local_58.values.values[1] = fVar17 * local_58.values.values[1];
        local_58.values.values[0] = fVar17 * local_58.values.values[0];
        local_58.values.values[2] = fVar17 * local_58.values.values[2];
        local_58.values.values[3] = fVar17 * local_58.values.values[3];
      }
      auVar32 = ZEXT1664(local_78);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar16 = vaddps_avx512vl(auVar16,auVar6);
      uVar9 = *(ulong *)((this->super_FilmBase).filter.
                         super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                         .bits & 0xffffffffffff);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar9;
      auVar6 = vsubps_avx(auVar16,auVar19);
      auVar20._0_4_ = auVar16._0_4_ + (float)uVar9;
      auVar20._4_4_ = auVar16._4_4_ + (float)(uVar9 >> 0x20);
      auVar20._8_4_ = auVar16._8_4_ + 0.0;
      auVar20._12_4_ = auVar16._12_4_ + 0.0;
      auVar16 = vroundps_avx(auVar20,9);
      auVar19 = vroundps_avx(auVar6,9);
      auVar6 = vpcmpeqd_avx(auVar6,auVar6);
      auVar21._0_4_ = (int)auVar16._0_4_;
      auVar21._4_4_ = (int)auVar16._4_4_;
      auVar21._8_4_ = (int)auVar16._8_4_;
      auVar21._12_4_ = (int)auVar16._12_4_;
      auVar24._0_4_ = (int)auVar19._0_4_;
      auVar24._4_4_ = (int)auVar19._4_4_;
      auVar24._8_4_ = (int)auVar19._8_4_;
      auVar24._12_4_ = (int)auVar19._12_4_;
      auVar6 = vpsubd_avx(auVar21,auVar6);
      auVar16 = vpminsd_avx(auVar6,auVar24);
      auVar6 = vpmaxsd_avx(auVar24,auVar6);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>;
      local_68 = vpmaxsd_avx(auVar16,auVar29);
      uVar12 = local_68._4_4_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar6 = vpminsd_avx(auVar30,auVar6);
      uVar9 = vpcmpd_avx512vl(local_68,auVar6,5);
      local_9c = auVar6._4_4_;
      if ((int)auVar6._4_4_ < (int)uVar12) {
        local_9c = uVar12;
      }
      if ((uVar9 & 3) == 0) {
        auVar35 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_88 = vmovshdup_avx(local_78);
        auVar31 = ZEXT1664(local_88);
        uVar33 = auVar34._0_4_;
        uVar14 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),local_68._0_4_);
        auVar37 = ZEXT1664(local_68);
        uVar9 = (ulong)uVar12 << 0x20 | uVar14;
        do {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
          local_98 = auVar37._0_16_;
          auVar16 = vcvtdq2ps_avx(local_98);
          auVar16 = vsubps_avx(auVar25,auVar16);
          auVar8._8_4_ = 0xbf000000;
          auVar8._0_8_ = 0xbf000000bf000000;
          auVar8._12_4_ = 0xbf000000;
          auVar16 = vaddps_avx512vl(auVar16,auVar8);
          local_a8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar16);
          uVar13 = (this->super_FilmBase).filter.
                   super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   .bits;
          uVar12 = (uint)(ushort)(uVar13 >> 0x30);
          auVar19 = auVar35._0_16_;
          if (uVar13 >> 0x30 < 3) {
            this_01 = (GaussianFilter *)(uVar13 & 0xffffffffffff);
            if (uVar12 == 2) {
              fVar17 = GaussianFilter::Evaluate(this_01,(Point2f *)&local_a8);
              goto LAB_003a1409;
            }
            auVar20 = vandps_avx(auVar16,auVar19);
            if (auVar20._0_4_ <= (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
              auVar16 = vmovshdup_avx(auVar16);
              auVar16 = vandps_avx(auVar16,auVar19);
              uVar7 = vcmpss_avx512f(auVar16,ZEXT416((uint)(this_01->radius).
                                                           super_Tuple2<pbrt::Vector2,_float>.y),2);
              fVar17 = (float)((uint)((byte)uVar7 & 1) * 0x3f800000);
              goto LAB_003a142a;
            }
          }
          else {
            uVar12 = uVar12 - 2;
            if (uVar12 < 2) {
              this_02 = (MitchellFilter *)(uVar13 & 0xffffffffffff);
              local_a0 = MitchellFilter::Mitchell1D
                                   (this_02,auVar16._0_4_ /
                                            (this_02->radius).super_Tuple2<pbrt::Vector2,_float>.x);
              FVar18 = MitchellFilter::Mitchell1D
                                 (this_02,local_a8.y /
                                          (this_02->radius).super_Tuple2<pbrt::Vector2,_float>.y);
              fVar17 = FVar18 * local_a0;
            }
            else {
              if (uVar12 != 2) {
                auVar26._8_8_ = 0;
                auVar26._0_8_ =
                     (((LanczosSincFilter *)(uVar13 & 0xffffffffffff))->radius).
                     super_Tuple2<pbrt::Vector2,_float>;
                auVar16 = vandps_avx(auVar16,auVar19);
                auVar16 = vsubps_avx(auVar26,auVar16);
                auVar16 = vmaxps_avx(auVar16,_DAT_00601010);
                auVar19 = vmovshdup_avx(auVar16);
                fVar17 = auVar16._0_4_ * auVar19._0_4_;
                goto LAB_003a142a;
              }
              fVar17 = LanczosSincFilter::Evaluate
                                 ((LanczosSincFilter *)(uVar13 & 0xffffffffffff),
                                  (Point2f *)&local_a8);
            }
LAB_003a1409:
            auVar37 = ZEXT1664(local_98);
            auVar35 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            auVar31 = ZEXT1664(local_88);
            auVar34 = ZEXT464(uVar33);
            auVar32 = ZEXT1664(local_78);
LAB_003a142a:
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              iVar2 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
              iVar3 = (this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
              iVar4 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
              lVar11 = 0;
              pPVar5 = (this->pixels).values;
              do {
                fVar23 = auVar32._0_4_;
                if (((int)lVar11 != 0) && (fVar23 = auVar31._0_4_, (int)lVar11 != 1)) {
                  fVar23 = auVar34._0_4_;
                }
                pAVar1 = pPVar5[(iVar3 - iVar2) * ((int)(uVar9 >> 0x20) - iVar4) +
                                ((int)uVar9 - iVar2)].splatRGB + lVar11;
                dVar28 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                do {
                  LOCK();
                  dVar10 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                  bVar15 = dVar28 == dVar10;
                  if (bVar15) {
                    (pAVar1->bits).super___atomic_base<unsigned_long>._M_i =
                         (__int_type_conflict1)(dVar28 + (double)(fVar17 * fVar23));
                    dVar10 = dVar28;
                  }
                  UNLOCK();
                  dVar28 = dVar10;
                } while (!bVar15);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
            }
          }
          uVar12 = auVar37._0_4_ + 1;
          uVar13 = uVar9 & 0xffffffff00000000;
          uVar9 = (uVar13 | uVar14) + 0x100000000;
          if (uVar12 != auVar6._0_4_) {
            uVar9 = uVar13 + uVar12;
          }
          auVar37 = ZEXT864(uVar9);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar9;
          uVar13 = vpcmpd_avx512vl(auVar36,local_68,4);
        } while (((uVar13 & 1) != 0) || (local_9c != (uint)(uVar9 >> 0x20)));
      }
      return;
    }
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x1ff,"Check failed: %s",(char (*) [13])"!L.HasNaNs()");
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    SampledSpectrum H = L * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        H *= maxComponentValue / m;
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}